

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

void lws_strexp_init(lws_strexp_t *exp,void *priv,lws_strexp_expand_cb cb,char *out,size_t olen)

{
  size_t olen_local;
  char *out_local;
  lws_strexp_expand_cb cb_local;
  void *priv_local;
  lws_strexp_t *exp_local;
  
  memset(exp,0,0x58);
  exp->cb = cb;
  exp->out = out;
  exp->olen = olen;
  exp->state = '\0';
  exp->priv = priv;
  return;
}

Assistant:

void
lws_strexp_init(lws_strexp_t *exp, void *priv, lws_strexp_expand_cb cb,
		 char *out, size_t olen)
{
	memset(exp, 0, sizeof(*exp));
	exp->cb = cb;
	exp->out = out;
	exp->olen = olen;
	exp->state = LWS_EXPS_LITERAL;
	exp->priv = priv;
}